

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_QSaveFileButton.cpp
# Opt level: O0

int __thiscall QSaveFileButton::qt_metacall(QSaveFileButton *this,Call _c,int _id,void **_a)

{
  undefined8 *in_RCX;
  int in_ESI;
  QEmbedableButton *in_RDI;
  void **in_stack_00000070;
  int in_stack_00000078;
  Call in_stack_0000007c;
  QObject *in_stack_00000080;
  int in_stack_ffffffffffffffc8;
  Call in_stack_ffffffffffffffcc;
  QMetaType local_28;
  undefined8 *local_20;
  int local_18;
  int local_14;
  int local_4;
  
  local_20 = in_RCX;
  local_14 = in_ESI;
  local_18 = QEmbedableButton::qt_metacall
                       (in_RDI,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,(void **)0x1d8062
                       );
  local_4 = local_18;
  if (-1 < local_18) {
    if (local_14 == 0) {
      if (local_18 < 1) {
        qt_static_metacall(in_stack_00000080,in_stack_0000007c,in_stack_00000078,in_stack_00000070);
      }
      local_18 = local_18 + -1;
    }
    else if (local_14 == 7) {
      if (local_18 < 1) {
        memset(&local_28,0,8);
        QMetaType::QMetaType(&local_28);
        *(QMetaTypeInterface **)*local_20 = local_28.d_ptr;
      }
      local_18 = local_18 + -1;
    }
    else if ((((local_14 == 1) || (local_14 == 2)) || (local_14 == 3)) ||
            ((local_14 == 8 || (local_14 == 6)))) {
      qt_static_metacall(in_stack_00000080,in_stack_0000007c,in_stack_00000078,in_stack_00000070);
      local_18 = local_18 + -5;
    }
    local_4 = local_18;
  }
  return local_4;
}

Assistant:

int QSaveFileButton::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QEmbedableButton::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 1)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 1;
    } else if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 1)
            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();
        _id -= 1;
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty || _c == QMetaObject::WriteProperty
            || _c == QMetaObject::ResetProperty || _c == QMetaObject::BindableProperty
            || _c == QMetaObject::RegisterPropertyMetaType) {
        qt_static_metacall(this, _c, _id, _a);
        _id -= 5;
    }
#endif // QT_NO_PROPERTIES
    return _id;
}